

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O0

void __thiscall Assimp::STEP::DB::SetInverseIndicesToTrack(DB *this,char **types,size_t N)

{
  ConversionSchema *this_00;
  char *pcVar1;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *sz;
  size_t i;
  size_t N_local;
  char **types_local;
  DB *this_local;
  
  sz = (char *)0x0;
  i = N;
  N_local = (size_t)types;
  types_local = (char **)this;
  while( true ) {
    if (i <= sz) {
      return;
    }
    this_00 = this->schema;
    pcVar1 = *(char **)(N_local + (long)sz * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar1,&local_51);
    pcVar1 = EXPRESS::ConversionSchema::GetStaticStringForToken(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    local_30 = pcVar1;
    if (pcVar1 == (char *)0x0) break;
    std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::insert
              (&this->inv_whitelist,&local_30);
    sz = sz + 1;
  }
  __assert_fail("sz",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/./code/Step/STEPFile.h"
                ,0x3db,
                "void Assimp::STEP::DB::SetInverseIndicesToTrack(const char *const *, size_t)");
}

Assistant:

void SetInverseIndicesToTrack( const char* const* types, size_t N ) {
            for(size_t i = 0; i < N;++i) {
                const char* const sz = schema->GetStaticStringForToken(types[i]);
                ai_assert(sz);
                inv_whitelist.insert(sz);
            }
        }